

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void Service_Browse_single
               (UA_Server *server,UA_Session *session,ContinuationPointEntry *cp,
               UA_BrowseDescription *descr,UA_UInt32 maxrefs,UA_BrowseResult *result)

{
  uint uVar1;
  UA_NodeStoreEntry *pUVar2;
  UA_NodeStoreEntry *pUVar3;
  UA_NodeStore *ns;
  ContinuationPointEntry *pCVar4;
  UA_NodeId *pUVar5;
  size_t sVar6;
  size_t sVar7;
  UA_Boolean UVar8;
  uint uVar9;
  UA_StatusCode UVar10;
  ulong uVar11;
  UA_NodeStoreEntry **ppUVar12;
  UA_ReferenceDescription *pUVar13;
  size_t sVar14;
  ContinuationPointEntry *pCVar15;
  UA_Guid *pUVar16;
  ulong uVar17;
  UA_BrowseDescription *pUVar18;
  UA_NodeId *pUVar19;
  UA_ExpandedNodeId *src;
  UA_ReferenceNode *pUVar20;
  UA_UInt32 UVar21;
  UA_NodeId *pUVar22;
  UA_NodeId *pUVar23;
  UA_NodeId *pUVar24;
  UA_Guid UVar25;
  UA_ReferenceDescription **local_98;
  size_t local_80;
  size_t relevant_refs_size;
  UA_NodeId *relevant_refs;
  ulong local_68;
  UA_ReferenceDescription *local_60;
  ulong local_58;
  UA_UInt32 local_4c;
  UA_NodeId *local_48;
  UA_BrowseDescription *local_40;
  char local_31;
  
  if (cp == (ContinuationPointEntry *)0x0) {
    uVar11 = 0;
  }
  else {
    descr = &cp->browseDescription;
    uVar11 = (ulong)cp->continuationIndex;
    maxrefs = cp->maxReferences;
  }
  if (UA_BROWSEDIRECTION_BOTH < descr->browseDirection) {
    result->statusCode = 0x804d0000;
    return;
  }
  local_80 = 0;
  relevant_refs_size = 0;
  pUVar22 = &descr->referenceTypeId;
  local_40 = descr;
  local_31 = UA_NodeId_isNull(pUVar22);
  if (!(bool)local_31) {
    ns = server->nodestore;
    ppUVar12 = findNode(ns,pUVar22);
    if ((ppUVar12 == (UA_NodeStoreEntry **)0x0) ||
       (((*ppUVar12)->node).nodeClass != UA_NODECLASS_REFERENCETYPE)) {
      result->statusCode = 0x804c0000;
      return;
    }
    if (local_40->includeSubtypes == true) {
      UVar10 = getTypeHierarchy(ns,&(*ppUVar12)->node,false,(UA_NodeId **)&relevant_refs_size,
                                &local_80);
      result->statusCode = UVar10;
      if (UVar10 != 0) {
        return;
      }
    }
    else {
      local_80 = 1;
      relevant_refs_size = (size_t)pUVar22;
    }
  }
  pUVar18 = local_40;
  ppUVar12 = findNode(server->nodestore,&local_40->nodeId);
  if (ppUVar12 == (UA_NodeStoreEntry **)0x0) {
    result->statusCode = 0x80340000;
LAB_001223de:
    if ((local_31 == '\0') && (local_40->includeSubtypes == true)) {
      UA_Array_delete((void *)relevant_refs_size,local_80,UA_TYPES + 0x10);
    }
    return;
  }
  pUVar2 = *ppUVar12;
  pUVar22 = (UA_NodeId *)(pUVar2->node).referencesSize;
  local_4c = maxrefs;
  if (pUVar22 == (UA_NodeId *)0x0) {
    result->referencesSize = 0;
    goto LAB_001223de;
  }
  pUVar23 = (UA_NodeId *)(ulong)maxrefs;
  pUVar19 = pUVar23;
  if (pUVar22 < pUVar23) {
    pUVar19 = pUVar22;
  }
  if (maxrefs == 0) {
    pUVar19 = pUVar22;
  }
  if (pUVar19 == (UA_NodeId *)0x0) {
    result->references = (UA_ReferenceDescription *)0x1;
    result->referencesSize = 0;
    local_68 = 0;
    pUVar19 = (UA_NodeId *)0x0;
LAB_00122444:
    UVar21 = local_4c;
    local_98 = &result->references;
    free(*local_98);
    *local_98 = (UA_ReferenceDescription *)0x0;
    local_48 = (UA_NodeId *)0x0;
    result->referencesSize = 0;
LAB_00122465:
    local_98 = &result->references;
    pUVar18 = local_40;
    if ((int)local_68 == 0) goto LAB_001224d2;
    UA_Array_delete(*local_98,(size_t)local_48,UA_TYPES + 0x76);
    *local_98 = (UA_ReferenceDescription *)0x0;
    result->referencesSize = 0;
    pUVar18 = local_40;
  }
  else {
    relevant_refs = pUVar19;
    pUVar13 = (UA_ReferenceDescription *)calloc((size_t)pUVar19,0xc0);
    sVar7 = relevant_refs_size;
    sVar6 = local_80;
    result->references = pUVar13;
    local_68 = 0;
    if (pUVar13 != (UA_ReferenceDescription *)0x0) {
      local_48 = (UA_NodeId *)0x0;
      uVar17 = 0;
      pUVar19 = (UA_NodeId *)0x0;
      pUVar24 = relevant_refs;
      do {
        pUVar20 = (pUVar2->node).references;
        if (pUVar20[(long)pUVar19].isInverse == true) {
          if (pUVar18->browseDirection != UA_BROWSEDIRECTION_FORWARD) {
LAB_001220f7:
            pUVar20 = pUVar20 + (long)pUVar19;
            local_58 = uVar17;
            sVar14 = sVar6;
            pUVar5 = (UA_NodeId *)sVar7;
            pUVar24 = relevant_refs;
            pUVar18 = local_40;
            if (local_31 == '\0') {
              for (; relevant_refs = pUVar24, local_58 = uVar17, local_40 = pUVar18, sVar14 != 0;
                  sVar14 = sVar14 - 1) {
                UVar8 = UA_NodeId_equal(&pUVar20->referenceTypeId,pUVar5);
                if (UVar8) goto LAB_00122104;
                uVar17 = local_58;
                pUVar5 = pUVar5 + 1;
                pUVar24 = relevant_refs;
                pUVar18 = local_40;
              }
            }
            else {
LAB_00122104:
              ppUVar12 = findNode(server->nodestore,&(pUVar20->targetId).nodeId);
              pUVar5 = local_48;
              uVar17 = local_58;
              pUVar18 = local_40;
              pUVar24 = relevant_refs;
              if (ppUVar12 != (UA_NodeStoreEntry **)0x0) {
                pUVar3 = *ppUVar12;
                if ((local_40->nodeClassMask == UA_NODECLASS_UNSPECIFIED) ||
                   (((pUVar3->node).nodeClass & local_40->nodeClassMask) != UA_NODECLASS_UNSPECIFIED
                   )) {
                  if (local_58 < uVar11) {
                    uVar17 = local_58 + 1;
                  }
                  else {
                    uVar1 = local_40->resultMask;
                    pUVar13 = result->references;
                    local_60 = pUVar13 + (long)local_48;
                    memset(local_60,0,0xc0);
                    uVar9 = UA_copy(&pUVar3->node,&pUVar13[(long)pUVar5].nodeId,UA_TYPES + 0x10);
                    if ((uVar1 & 1) != 0) {
                      UVar10 = UA_copy(pUVar20,local_60,UA_TYPES + 0x10);
                      uVar9 = uVar9 | UVar10;
                    }
                    pUVar18 = local_40;
                    pUVar24 = relevant_refs;
                    if ((uVar1 & 2) != 0) {
                      local_60->isForward = (UA_Boolean)(pUVar20->isInverse ^ 1);
                    }
                    if ((uVar1 & 4) != 0) {
                      local_60->nodeClass = (pUVar3->node).nodeClass;
                    }
                    if ((uVar1 & 8) != 0) {
                      UVar10 = UA_copy(&(pUVar3->node).browseName,&local_60->browseName,
                                       UA_TYPES + 0x13);
                      uVar9 = uVar9 | UVar10;
                    }
                    if ((uVar1 & 0x10) != 0) {
                      UVar10 = UA_copy(&(pUVar3->node).displayName,&local_60->displayName,
                                       UA_TYPES + 0x14);
                      uVar9 = uVar9 | UVar10;
                    }
                    if ((((uVar1 & 0x20) != 0) &&
                        ((pUVar3->node).nodeClass - UA_NODECLASS_OBJECT < 2)) &&
                       (sVar14 = (pUVar3->node).referencesSize, sVar14 != 0)) {
                      src = &((pUVar3->node).references)->targetId;
                      do {
                        if (*(int *)((long)(src + -1) + 0x18) == 0x28) {
                          UVar10 = UA_copy(src,&local_60->typeDefinition,UA_TYPES + 0x11);
                          uVar9 = uVar9 | UVar10;
                          break;
                        }
                        src = (UA_ExpandedNodeId *)((long)(src + 1) + 0x20);
                        sVar14 = sVar14 - 1;
                      } while (sVar14 != 0);
                    }
                    local_68 = (ulong)((uint)local_68 | uVar9);
                    local_48 = (UA_NodeId *)((long)&local_48->namespaceIndex + 1);
                    pUVar22 = (UA_NodeId *)(pUVar2->node).referencesSize;
                    uVar17 = local_58;
                  }
                }
              }
            }
          }
        }
        else if (pUVar18->browseDirection != UA_BROWSEDIRECTION_INVERSE) goto LAB_001220f7;
        pUVar19 = (UA_NodeId *)((long)&pUVar19->namespaceIndex + 1);
      } while ((pUVar19 < pUVar22) && (local_48 < pUVar24));
      result->referencesSize = (size_t)local_48;
      UVar21 = local_4c;
      if (local_48 == (UA_NodeId *)0x0) goto LAB_00122444;
      goto LAB_00122465;
    }
    local_68 = 0x80030000;
    pUVar19 = (UA_NodeId *)0x0;
    local_48 = (UA_NodeId *)0x0;
    UVar21 = local_4c;
  }
  result->statusCode = (UA_StatusCode)local_68;
LAB_001224d2:
  if ((local_31 == '\0') && (pUVar18->includeSubtypes == true)) {
    UA_Array_delete((void *)relevant_refs_size,local_80,UA_TYPES + 0x10);
  }
  if (result->statusCode != 0) {
    return;
  }
  if (cp != (ContinuationPointEntry *)0x0) {
    if (pUVar19 == (UA_NodeId *)(pUVar2->node).referencesSize) {
      removeCp(cp,session);
      return;
    }
    cp->continuationIndex = cp->continuationIndex + (int)local_48;
    UA_copy(&cp->identifier,&result->continuationPoint,UA_TYPES + 0xe);
    return;
  }
  if (local_48 < pUVar23 || UVar21 == 0) {
    return;
  }
  if ((session->availableContinuationPoints != 0) &&
     (pCVar15 = (ContinuationPointEntry *)malloc(0x70), pCVar15 != (ContinuationPointEntry *)0x0)) {
    UA_copy(local_40,&pCVar15->browseDescription,UA_TYPES + 0x6c);
    pCVar15->maxReferences = UVar21;
    pCVar15->continuationIndex = (UA_UInt32)local_48;
    pUVar16 = (UA_Guid *)calloc(1,0x10);
    UVar25 = UA_Guid_random();
    *pUVar16 = UVar25;
    (pCVar15->identifier).data = (UA_Byte *)pUVar16;
    (pCVar15->identifier).length = 0x10;
    UA_copy(&pCVar15->identifier,&result->continuationPoint,UA_TYPES + 0xe);
    pCVar4 = (session->continuationPoints).lh_first;
    (pCVar15->pointers).le_next = pCVar4;
    if (pCVar4 != (ContinuationPointEntry *)0x0) {
      (pCVar4->pointers).le_prev = (ContinuationPointEntry **)pCVar15;
    }
    (session->continuationPoints).lh_first = pCVar15;
    (pCVar15->pointers).le_prev = &(session->continuationPoints).lh_first;
    session->availableContinuationPoints = session->availableContinuationPoints - 1;
    return;
  }
  result->statusCode = 0x804b0000;
  return;
}

Assistant:

void
Service_Browse_single(UA_Server *server, UA_Session *session,
                      struct ContinuationPointEntry *cp, const UA_BrowseDescription *descr,
                      UA_UInt32 maxrefs, UA_BrowseResult *result) { 
    size_t referencesCount = 0;
    size_t referencesIndex = 0;
    /* set the browsedescription if a cp is given */
    UA_UInt32 continuationIndex = 0;
    if(cp) {
        descr = &cp->browseDescription;
        maxrefs = cp->maxReferences;
        continuationIndex = cp->continuationIndex;
    }

    /* is the browsedirection valid? */
    if(descr->browseDirection != UA_BROWSEDIRECTION_BOTH &&
       descr->browseDirection != UA_BROWSEDIRECTION_FORWARD &&
       descr->browseDirection != UA_BROWSEDIRECTION_INVERSE) {
        result->statusCode = UA_STATUSCODE_BADBROWSEDIRECTIONINVALID;
        return;
    }
    
    /* get the references that match the browsedescription */
    size_t relevant_refs_size = 0;
    UA_NodeId *relevant_refs = NULL;
    UA_Boolean all_refs = UA_NodeId_isNull(&descr->referenceTypeId);
    if(!all_refs) {
        const UA_Node *rootRef = UA_NodeStore_get(server->nodestore, &descr->referenceTypeId);
        if(!rootRef || rootRef->nodeClass != UA_NODECLASS_REFERENCETYPE) {
            result->statusCode = UA_STATUSCODE_BADREFERENCETYPEIDINVALID;
            return;
        }
        if(descr->includeSubtypes) {
            result->statusCode = getTypeHierarchy(server->nodestore, rootRef, false,
                                                  &relevant_refs, &relevant_refs_size);
            if(result->statusCode != UA_STATUSCODE_GOOD)
                return;
        } else {
            relevant_refs = (UA_NodeId*)(uintptr_t)&descr->referenceTypeId;
            relevant_refs_size = 1;
        }
    }

    /* get the node */
    const UA_Node *node = UA_NodeStore_get(server->nodestore, &descr->nodeId);
    if(!node) {
        result->statusCode = UA_STATUSCODE_BADNODEIDUNKNOWN;
        if(!all_refs && descr->includeSubtypes)
            UA_Array_delete(relevant_refs, relevant_refs_size, &UA_TYPES[UA_TYPES_NODEID]);
        return;
    }

    /* if the node has no references, just return */
    if(node->referencesSize == 0) {
        result->referencesSize = 0;
        if(!all_refs && descr->includeSubtypes)
            UA_Array_delete(relevant_refs, relevant_refs_size, &UA_TYPES[UA_TYPES_NODEID]);
        return;
    }

    /* how many references can we return at most? */
    size_t real_maxrefs = maxrefs;
    if(real_maxrefs == 0)
        real_maxrefs = node->referencesSize;
    else if(real_maxrefs > node->referencesSize)
        real_maxrefs = node->referencesSize;
    result->references = UA_Array_new(real_maxrefs, &UA_TYPES[UA_TYPES_REFERENCEDESCRIPTION]);
    if(!result->references) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        goto cleanup;
    }

    /* loop over the node's references */
    size_t skipped = 0;
    UA_Boolean isExternal = false;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    for(; referencesIndex < node->referencesSize && referencesCount < real_maxrefs; ++referencesIndex) {
        isExternal = false;
        const UA_Node *current =
            returnRelevantNode(server, descr, all_refs, &node->references[referencesIndex],
                               relevant_refs, relevant_refs_size, &isExternal);
        if(!current)
            continue;

        if(skipped < continuationIndex) {
            ++skipped;
        } else {
            retval |= fillReferenceDescription(server->nodestore, current,
                                               &node->references[referencesIndex],
                                               descr->resultMask,
                                               &result->references[referencesCount]);
            ++referencesCount;
        }
    }
    result->referencesSize = referencesCount;

    if(referencesCount == 0) {
        UA_free(result->references);
        result->references = NULL;
        result->referencesSize = 0;
    }

    if(retval != UA_STATUSCODE_GOOD) {
        UA_Array_delete(result->references, result->referencesSize,
                        &UA_TYPES[UA_TYPES_REFERENCEDESCRIPTION]);
        result->references = NULL;
        result->referencesSize = 0;
        result->statusCode = retval;
    }

 cleanup:
    if(!all_refs && descr->includeSubtypes)
        UA_Array_delete(relevant_refs, relevant_refs_size, &UA_TYPES[UA_TYPES_NODEID]);
    if(result->statusCode != UA_STATUSCODE_GOOD)
        return;

    /* create, update, delete continuation points */
    if(cp) {
        if(referencesIndex == node->referencesSize) {
            /* all done, remove a finished continuationPoint */
            removeCp(cp, session);
        } else {
            /* update the cp and return the cp identifier */
            cp->continuationIndex += (UA_UInt32)referencesCount;
            UA_ByteString_copy(&cp->identifier, &result->continuationPoint);
        }
    } else if(maxrefs != 0 && referencesCount >= maxrefs) {
        /* create a cp */
        if(session->availableContinuationPoints <= 0 ||
           !(cp = UA_malloc(sizeof(struct ContinuationPointEntry)))) {
            result->statusCode = UA_STATUSCODE_BADNOCONTINUATIONPOINTS;
            return;
        }
        UA_BrowseDescription_copy(descr, &cp->browseDescription);
        cp->maxReferences = maxrefs;
        cp->continuationIndex = (UA_UInt32)referencesCount;
        UA_Guid *ident = UA_Guid_new();
        *ident = UA_Guid_random();
        cp->identifier.data = (UA_Byte*)ident;
        cp->identifier.length = sizeof(UA_Guid);
        UA_ByteString_copy(&cp->identifier, &result->continuationPoint);

        /* store the cp */
        LIST_INSERT_HEAD(&session->continuationPoints, cp, pointers);
        --session->availableContinuationPoints;
    }
}